

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontCFF.cpp
# Opt level: O3

bool __thiscall
WrittenFontCFF::HasEnoughSpaceForGlyphs
          (WrittenFontCFF *this,GlyphUnicodeMappingListList *inGlyphsList)

{
  _Rb_tree_header *p_Var1;
  ushort uVar2;
  WrittenFontRepresentation *pWVar3;
  _Base_ptr p_Var4;
  int iVar5;
  _List_node_base *p_Var6;
  _Base_ptr p_Var7;
  _Rb_tree_color _Var8;
  _List_node_base *p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  bool bVar12;
  
  p_Var6 = (inGlyphsList->
           super__List_base<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var6 == (_List_node_base *)inGlyphsList) {
    iVar5 = 0;
  }
  else {
    pWVar3 = (this->super_AbstractWrittenFont).mANSIRepresentation;
    p_Var1 = &(pWVar3->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header;
    iVar5 = 0;
    do {
      p_Var9 = p_Var6[1]._M_next;
      if (p_Var9 != p_Var6 + 1) {
        p_Var4 = (pWVar3->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent;
        do {
          p_Var11 = &p_Var1->_M_header;
          if (p_Var4 != (_Base_ptr)0x0) {
            uVar2 = *(ushort *)((long)(p_Var9 + 2) + 8);
            p_Var7 = &p_Var1->_M_header;
            p_Var10 = p_Var4;
            do {
              _Var8 = (_Rb_tree_color)uVar2;
              bVar12 = p_Var10[1]._M_color < _Var8;
              if (!bVar12) {
                p_Var7 = p_Var10;
              }
              p_Var10 = (&p_Var10->_M_left)[bVar12];
            } while (p_Var10 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
               (p_Var11 = p_Var7, _Var8 <= p_Var7[1]._M_color && p_Var7[1]._M_color != (uint)uVar2))
            {
              p_Var11 = &p_Var1->_M_header;
            }
          }
          iVar5 = iVar5 + (uint)((_Rb_tree_header *)p_Var11 == p_Var1);
          p_Var9 = p_Var9->_M_next;
        } while (p_Var9 != p_Var6 + 1);
      }
      p_Var6 = (((_List_base<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
                  *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var6 != (_List_node_base *)inGlyphsList);
  }
  return iVar5 <= (int)(uint)this->mAvailablePositionsCount;
}

Assistant:

bool WrittenFontCFF::HasEnoughSpaceForGlyphs(const GlyphUnicodeMappingListList& inGlyphsList)
{
	GlyphUnicodeMappingListList::const_iterator itList = inGlyphsList.begin();
	GlyphUnicodeMappingList::const_iterator it;
	int glyphsToAddCount = 0;

	for(; itList != inGlyphsList.end(); ++itList)
	{
		it = itList->begin();
		for(; it != itList->end(); ++it)
			if(mANSIRepresentation->mGlyphIDToEncodedChar.find(it->mGlyphCode) == mANSIRepresentation->mGlyphIDToEncodedChar.end())
				++glyphsToAddCount;
	}

	return glyphsToAddCount <= mAvailablePositionsCount;
}